

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O2

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
          (task_pool *this,lzcompressor *pObject,offset_in_lzcompressor_to_subr pObject_method,
          uint64 first_data,uint num_tasks,void *pData_ptr)

{
  bool bVar1;
  object_task<lzham::lzcompressor> *poVar2;
  undefined4 in_register_00000084;
  int iVar3;
  uint uVar4;
  long lVar5;
  undefined8 in_stack_00000008;
  task tsk;
  undefined4 local_74;
  lzcompressor *local_70;
  task local_68;
  lzcompressor *local_40;
  uint64 local_38;
  
  iVar3 = (int)pData_ptr;
  if (iVar3 == 0) {
    bVar1 = true;
  }
  else {
    local_70 = pObject;
    local_40 = (lzcompressor *)pObject_method;
    local_38 = first_data;
    for (lVar5 = 0; uVar4 = (int)lVar5 + iVar3 + -1, -1 < (int)uVar4; lVar5 = lVar5 + -1) {
      local_68.field_2._0_4_ = 0;
      local_68.field_2._4_4_ = 0;
      local_68.m_flags = 0;
      local_68.m_data = 0;
      local_68.m_pData_ptr._0_4_ = 0;
      local_68.m_pData_ptr._4_4_ = 0;
      local_74 = 1;
      poVar2 = lzham_new<lzham::object_task<lzham::lzcompressor>,void*,lzham::lzcompressor*,void(lzham::lzcompressor::*)(unsigned_long_long,void*),lzham::object_task_flags>
                         ((lzham *)this->m_malloc_context,&this->m_malloc_context,&local_70,
                          &local_40,(offset_in_lzcompressor_to_subr *)&local_74,
                          (object_task_flags *)pData_ptr);
      local_68.field_2._0_4_ = SUB84(poVar2,0);
      local_68.field_2._4_4_ = (undefined4)((ulong)poVar2 >> 0x20);
      if (poVar2 == (object_task<lzham::lzcompressor> *)0x0) break;
      local_68.m_data = (ulong)(uVar4 & 0x7fffffff) + CONCAT44(in_register_00000084,num_tasks);
      local_68.m_pData_ptr._0_4_ = (undefined4)in_stack_00000008;
      local_68.m_pData_ptr._4_4_ = (undefined4)((ulong)in_stack_00000008 >> 0x20);
      local_68.m_flags = 1;
      bVar1 = tsstack<lzham::task_pool::task,_64U>::try_push(&this->m_task_stack,&local_68);
      if (!bVar1) break;
    }
    bVar1 = SUB41(uVar4 >> 0x1f,0);
    if ((int)lVar5 != 0) {
      LOCK();
      this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + -lVar5;
      UNLOCK();
      semaphore::release(&this->m_tasks_available,-lVar5);
    }
  }
  return bVar1;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint total_to_release = 0;

      for (int i = num_tasks - 1; i >= 0; --i)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(m_malloc_context, m_malloc_context, pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }

         total_to_release++;
      }

      if (total_to_release)
      {
         atomic_add32(&m_num_outstanding_tasks, total_to_release);

         m_tasks_available.release(total_to_release);
      }

      return status;
   }